

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  char head_type_00;
  uint *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int *piVar6;
  ulong min;
  void *pp;
  uLong uVar7;
  unsigned_long crc32_val;
  uint flags;
  int ret;
  char head_type;
  size_t skip;
  rar *rar;
  char *p;
  void *h;
  archive_entry *entry_local;
  archive_read *a_local;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar1 = (uint *)a->format->data;
  if (puVar1[0x13c4] == 0xffffffff) {
    puVar1[0x13c4] = 0;
  }
  piVar6 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar6 == (int *)0x0) {
    a_local._4_4_ = 1;
  }
  else if (((puVar1[0x3e] != 0) ||
           ((((char)*piVar6 != 'M' || (*(char *)((long)piVar6 + 1) != 'Z')) &&
            (*piVar6 != 0x464c457f)))) || (a_local._4_4_ = skip_sfx(a), -0x15 < a_local._4_4_)) {
    puVar1[0x3e] = 1;
    do {
      rar = (rar *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if (rar == (rar *)0x0) {
        return -0x1e;
      }
      head_type_00 = *(char *)((long)&rar->main_flags + 2);
      switch(head_type_00) {
      case 'r':
        iVar5 = memcmp(rar,"Rar!\x1a\a",7);
        if (iVar5 != 0) {
          archive_set_error(&a->archive,0x54,"Invalid marker header");
          return -0x1e;
        }
        __archive_read_consume(a,7);
        break;
      case 's':
        uVar2 = archive_le16dec((void *)((long)&rar->main_flags + 3));
        *puVar1 = (uint)uVar2;
        uVar2 = archive_le16dec(&rar->field_0x5);
        min = (ulong)uVar2;
        if (min < 0xd) {
          archive_set_error(&a->archive,0x54,"Invalid header size");
          return -0x1e;
        }
        pp = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pp == (void *)0x0) {
          return -0x1e;
        }
        *(undefined2 *)(puVar1 + 4) = *(undefined2 *)((long)pp + 7);
        *(undefined4 *)((long)puVar1 + 0x12) = *(undefined4 *)((long)pp + 9);
        if ((*puVar1 & 0x200) != 0) {
          if (min < 0xe) {
            archive_set_error(&a->archive,0x54,"Invalid header size");
            return -0x1e;
          }
          *(undefined1 *)((long)puVar1 + 0x16) = *(undefined1 *)((long)pp + 0xd);
        }
        if ((*puVar1 & 0x80) != 0) {
          archive_entry_set_is_metadata_encrypted(entry,'\x01');
          archive_entry_set_is_data_encrypted(entry,'\x01');
          puVar1[0x13c4] = 1;
          archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
          return -0x1e;
        }
        uVar7 = cm_zlib_crc32(0,(uchar *)((long)pp + 2),uVar2 - 2);
        uVar2 = archive_le16dec(pp);
        if ((uVar7 & 0xffff) != (ulong)uVar2) {
          archive_set_error(&a->archive,0x54,"Header CRC error");
          return -0x1e;
        }
        __archive_read_consume(a,min);
        break;
      case 't':
        iVar5 = read_header(a,entry,head_type_00);
        return iVar5;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar2 = archive_le16dec((void *)((long)&rar->main_flags + 3));
        uVar3 = archive_le16dec(&rar->field_0x5);
        _ret = (ulong)uVar3;
        if (_ret < 7) {
          archive_set_error(&a->archive,0x54,"Invalid header size");
          return -0x1e;
        }
        if ((7 < _ret) &&
           (rar = (rar *)__archive_read_ahead(a,_ret,(ssize_t *)0x0), rar == (rar *)0x0)) {
          return -0x1e;
        }
        if ((uVar2 & 0x8000) != 0) {
          if (_ret < 0xb) {
            archive_set_error(&a->archive,0x54,"Invalid header size");
            return -0x1e;
          }
          uVar4 = archive_le32dec(&rar->field_0x7);
          _ret = uVar4 + _ret;
          rar = (rar *)__archive_read_ahead(a,_ret,(ssize_t *)0x0);
          if (rar == (rar *)0x0) {
            return -0x1e;
          }
        }
        uVar7 = cm_zlib_crc32(0,(uchar *)((long)&rar->main_flags + 2),(int)_ret - 2);
        uVar2 = archive_le16dec(rar);
        if ((uVar7 & 0xffff) != (ulong)uVar2) {
          archive_set_error(&a->archive,0x54,"Header CRC error");
          return -0x1e;
        }
        __archive_read_consume(a,_ret);
        if (head_type_00 == '{') {
          return 1;
        }
        break;
      case 'z':
        iVar5 = read_header(a,entry,head_type_00);
        if (iVar5 < -0x14) {
          return iVar5;
        }
        break;
      default:
        archive_set_error(&a->archive,0x54,"Bad RAR file");
        return -0x1e;
      }
    } while( true );
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrytped, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if (skip > 7) {
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        skip += archive_le32dec(p + 7);
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      if (head_type == ENDARC_HEAD)
        return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}